

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.c
# Opt level: O0

el_action_t ce_inc_search(EditLine *el,wchar_t dir)

{
  wchar_t wVar1;
  size_t sVar2;
  size_t sVar3;
  wchar_t *pwVar4;
  bool bVar5;
  bool bVar6;
  el_action_t eVar7;
  wchar_t wVar8;
  wchar_t *pwVar9;
  char *pcVar10;
  int iVar11;
  bool bVar12;
  wchar_t *local_80;
  wchar_t *local_70;
  wchar_t redo;
  wchar_t done;
  wchar_t newdir;
  size_t oldpatlen;
  wchar_t ohisteventno;
  el_action_t ret;
  wchar_t *cp;
  wchar_t ch;
  wchar_t oldpchar;
  wchar_t *ocursor;
  EditLine *pEStack_18;
  wchar_t dir_local;
  EditLine *el_local;
  
  _ch = (el->el_line).cursor;
  cp._4_4_ = ce_inc_search::pchar;
  oldpatlen._7_1_ = '\0';
  wVar1 = (el->el_history).eventno;
  sVar2 = (el->el_search).patlen;
  redo = dir;
  ocursor._4_4_ = dir;
  pEStack_18 = el;
  if ((el->el_line).lastchar + (el->el_search).patlen + 6 < (el->el_line).limit) {
    do {
      if ((pEStack_18->el_search).patlen == 0) {
        ce_inc_search::pchar = L':';
        sVar3 = (pEStack_18->el_search).patlen;
        (pEStack_18->el_search).patlen = sVar3 + 1;
        (pEStack_18->el_search).patbuf[sVar3] = L'.';
        sVar3 = (pEStack_18->el_search).patlen;
        (pEStack_18->el_search).patlen = sVar3 + 1;
        (pEStack_18->el_search).patbuf[sVar3] = L'*';
      }
      bVar6 = false;
      bVar5 = false;
      pwVar9 = (pEStack_18->el_line).lastchar;
      (pEStack_18->el_line).lastchar = pwVar9 + 1;
      *pwVar9 = L'\n';
      _ohisteventno = L"fwd";
      if (redo == L'\x18') {
        _ohisteventno = L"bck";
      }
      while (wVar8 = ce_inc_search::pchar, *_ohisteventno != L'\0') {
        wVar8 = *_ohisteventno;
        pwVar9 = (pEStack_18->el_line).lastchar;
        (pEStack_18->el_line).lastchar = pwVar9 + 1;
        *pwVar9 = wVar8;
        _ohisteventno = _ohisteventno + 1;
      }
      pwVar9 = (pEStack_18->el_line).lastchar;
      (pEStack_18->el_line).lastchar = pwVar9 + 1;
      *pwVar9 = wVar8;
      _ohisteventno = (pEStack_18->el_search).patbuf + 2;
      while (_ohisteventno < (pEStack_18->el_search).patbuf + (pEStack_18->el_search).patlen) {
        wVar8 = *_ohisteventno;
        pwVar9 = (pEStack_18->el_line).lastchar;
        (pEStack_18->el_line).lastchar = pwVar9 + 1;
        *pwVar9 = wVar8;
        _ohisteventno = _ohisteventno + 1;
      }
      *(pEStack_18->el_line).lastchar = L'\0';
      re_refresh(pEStack_18);
      wVar8 = el_wgetc(pEStack_18,(wchar_t *)&cp);
      if (wVar8 != L'\x01') {
        eVar7 = ed_end_of_file(pEStack_18,0);
        return eVar7;
      }
      switch((pEStack_18->el_map).current[(byte)cp]) {
      case '\x04':
      case '\"':
        bVar5 = (pEStack_18->el_search).patlen < 3;
        if (bVar5) {
          terminal_beep(pEStack_18);
        }
        bVar5 = !bVar5;
        break;
      default:
        if ((wchar_t)cp == L'\a') {
          oldpatlen._7_1_ = '\x06';
          bVar5 = true;
        }
        else if ((wchar_t)cp == L'\x17') {
          for (_ohisteventno = (pEStack_18->el_search).patbuf + 2;
              _ohisteventno < (pEStack_18->el_search).patbuf + (pEStack_18->el_search).patlen;
              _ohisteventno = _ohisteventno + 1) {
            pcVar10 = strchr("*[]?",*_ohisteventno);
            if (pcVar10 != (char *)0x0) {
              terminal_beep(pEStack_18);
              goto LAB_00115afe;
            }
          }
          if ((pEStack_18->el_line).cursor != (pEStack_18->el_line).buffer) {
            (pEStack_18->el_line).cursor =
                 (pEStack_18->el_line).cursor + ((pEStack_18->el_search).patlen - 3);
            pwVar9 = c__next_word((pEStack_18->el_line).cursor,(pEStack_18->el_line).lastchar,
                                  L'\x01',ce__isword);
            while( true ) {
              bVar12 = false;
              if ((pEStack_18->el_line).cursor < pwVar9) {
                bVar12 = *(pEStack_18->el_line).cursor != L'\n';
              }
              if (!bVar12) goto LAB_00115a75;
              if (0x3fd < (pEStack_18->el_search).patlen) break;
              wVar8 = *(pEStack_18->el_line).cursor;
              sVar3 = (pEStack_18->el_search).patlen;
              (pEStack_18->el_search).patlen = sVar3 + 1;
              (pEStack_18->el_search).patbuf[sVar3] = wVar8;
              pwVar4 = (pEStack_18->el_line).cursor;
              (pEStack_18->el_line).cursor = pwVar4 + 1;
              wVar8 = *pwVar4;
              pwVar4 = (pEStack_18->el_line).lastchar;
              (pEStack_18->el_line).lastchar = pwVar4 + 1;
              *pwVar4 = wVar8;
            }
            terminal_beep(pEStack_18);
LAB_00115a75:
            (pEStack_18->el_line).cursor = _ch;
            *(pEStack_18->el_line).lastchar = L'\0';
            re_refresh(pEStack_18);
          }
        }
        else {
          if ((wchar_t)cp != L'\x1b') {
            ce_inc_search::endcmd[0] = (wchar_t)cp;
            el_wpush(pEStack_18,ce_inc_search::endcmd);
          }
          oldpatlen._7_1_ = '\x04';
          bVar5 = true;
        }
        break;
      case '\x06':
      case '\t':
        if ((pEStack_18->el_search).patlen < 0x3fe) {
          sVar3 = (pEStack_18->el_search).patlen;
          (pEStack_18->el_search).patlen = sVar3 + 1;
          (pEStack_18->el_search).patbuf[sVar3] = (wchar_t)cp;
          pwVar9 = (pEStack_18->el_line).lastchar;
          (pEStack_18->el_line).lastchar = pwVar9 + 1;
          *pwVar9 = (wchar_t)cp;
          *(pEStack_18->el_line).lastchar = L'\0';
          re_refresh(pEStack_18);
        }
        else {
          terminal_beep(pEStack_18);
        }
        break;
      case '%':
        redo = L'\x17';
        bVar6 = true;
        break;
      case '&':
        redo = L'\x18';
        bVar6 = true;
      }
LAB_00115afe:
      while( true ) {
        bVar12 = false;
        if ((pEStack_18->el_line).buffer < (pEStack_18->el_line).lastchar) {
          bVar12 = *(pEStack_18->el_line).lastchar != L'\n';
        }
        if (!bVar12) break;
        pwVar9 = (pEStack_18->el_line).lastchar;
        (pEStack_18->el_line).lastchar = pwVar9 + -1;
        *pwVar9 = L'\0';
      }
      *(pEStack_18->el_line).lastchar = L'\0';
      if (!bVar5) {
        cp._0_4_ = L']';
        for (_ohisteventno = (pEStack_18->el_search).patbuf + ((pEStack_18->el_search).patlen - 1);
            (pEStack_18->el_search).patbuf + 2 <= _ohisteventno; _ohisteventno = _ohisteventno + -1)
        {
          if ((*_ohisteventno == L'[') || (*_ohisteventno == L']')) {
            cp._0_4_ = *_ohisteventno;
            break;
          }
        }
        if ((2 < (pEStack_18->el_search).patlen) && ((wchar_t)cp != L'[')) {
          if ((bVar6) && (redo == ocursor._4_4_)) {
            if (ce_inc_search::pchar == L'?') {
              wVar8 = L'\x7fffffff';
              if (redo == L'\x18') {
                wVar8 = L'\0';
              }
              (pEStack_18->el_history).eventno = wVar8;
              eVar7 = hist_get(pEStack_18);
              if (eVar7 == '\x06') {
                hist_get(pEStack_18);
              }
              if (redo == L'\x18') {
                local_70 = (pEStack_18->el_line).lastchar;
              }
              else {
                local_70 = (pEStack_18->el_line).buffer;
              }
              (pEStack_18->el_line).cursor = local_70;
            }
            else {
              iVar11 = 1;
              if (redo == L'\x18') {
                iVar11 = -1;
              }
              (pEStack_18->el_line).cursor = (pEStack_18->el_line).cursor + iVar11;
            }
          }
          sVar3 = (pEStack_18->el_search).patlen;
          (pEStack_18->el_search).patlen = sVar3 + 1;
          (pEStack_18->el_search).patbuf[sVar3] = L'.';
          sVar3 = (pEStack_18->el_search).patlen;
          (pEStack_18->el_search).patlen = sVar3 + 1;
          (pEStack_18->el_search).patbuf[sVar3] = L'*';
          (pEStack_18->el_search).patbuf[(pEStack_18->el_search).patlen] = L'\0';
          if ((((pEStack_18->el_line).cursor < (pEStack_18->el_line).buffer) ||
              ((pEStack_18->el_line).lastchar < (pEStack_18->el_line).cursor)) ||
             (oldpatlen._7_1_ = ce_search_line(pEStack_18,redo), oldpatlen._7_1_ == '\x06')) {
            (pEStack_18->el_state).lastcmd = (el_action_t)redo;
            if (redo == L'\x18') {
              oldpatlen._7_1_ = ed_search_prev_history(pEStack_18,0);
            }
            else {
              oldpatlen._7_1_ = ed_search_next_history(pEStack_18,0);
            }
            if (oldpatlen._7_1_ != '\x06') {
              if (redo == L'\x18') {
                local_80 = (pEStack_18->el_line).lastchar;
              }
              else {
                local_80 = (pEStack_18->el_line).buffer;
              }
              (pEStack_18->el_line).cursor = local_80;
              ce_search_line(pEStack_18,redo);
            }
          }
          (pEStack_18->el_search).patlen = (pEStack_18->el_search).patlen - 2;
          (pEStack_18->el_search).patbuf[(pEStack_18->el_search).patlen] = L'\0';
          if (oldpatlen._7_1_ == '\x06') {
            terminal_beep(pEStack_18);
            if ((pEStack_18->el_history).eventno != wVar1) {
              (pEStack_18->el_history).eventno = wVar1;
              eVar7 = hist_get(pEStack_18);
              if (eVar7 == '\x06') {
                return '\x06';
              }
            }
            (pEStack_18->el_line).cursor = _ch;
            ce_inc_search::pchar = L'?';
          }
          else {
            ce_inc_search::pchar = L':';
          }
        }
        oldpatlen._7_1_ = ce_inc_search(pEStack_18,redo);
        if (((oldpatlen._7_1_ == '\x06') && (ce_inc_search::pchar == L'?')) && (cp._4_4_ == L':')) {
          oldpatlen._7_1_ = '\0';
        }
      }
      if ((oldpatlen._7_1_ == '\0') || ((oldpatlen._7_1_ == '\x06' && (sVar2 == 0)))) {
        ce_inc_search::pchar = cp._4_4_;
        (pEStack_18->el_search).patlen = sVar2;
        if ((pEStack_18->el_history).eventno != wVar1) {
          (pEStack_18->el_history).eventno = wVar1;
          eVar7 = hist_get(pEStack_18);
          if (eVar7 == '\x06') {
            return '\x06';
          }
        }
        (pEStack_18->el_line).cursor = _ch;
        if (oldpatlen._7_1_ == '\x06') {
          re_refresh(pEStack_18);
        }
      }
    } while ((!bVar5) && (oldpatlen._7_1_ == '\0'));
    el_local._7_1_ = oldpatlen._7_1_;
  }
  else {
    el_local._7_1_ = '\x06';
  }
  return el_local._7_1_;
}

Assistant:

libedit_private el_action_t
ce_inc_search(EditLine *el, int dir)
{
	static const wchar_t STRfwd[] = L"fwd", STRbck[] = L"bck";
	static wchar_t pchar = L':';  /* ':' = normal, '?' = failed */
	static wchar_t endcmd[2] = {'\0', '\0'};
	wchar_t *ocursor = el->el_line.cursor, oldpchar = pchar, ch;
	const wchar_t *cp;

	el_action_t ret = CC_NORM;

	int ohisteventno = el->el_history.eventno;
	size_t oldpatlen = el->el_search.patlen;
	int newdir = dir;
	int done, redo;

	if (el->el_line.lastchar + sizeof(STRfwd) /
	    sizeof(*el->el_line.lastchar) + 2 +
	    el->el_search.patlen >= el->el_line.limit)
		return CC_ERROR;

	for (;;) {

		if (el->el_search.patlen == 0) {	/* first round */
			pchar = ':';
#ifdef ANCHOR
#define	LEN	2
			el->el_search.patbuf[el->el_search.patlen++] = '.';
			el->el_search.patbuf[el->el_search.patlen++] = '*';
#else
#define	LEN	0
#endif
		}
		done = redo = 0;
		*el->el_line.lastchar++ = '\n';
		for (cp = (newdir == ED_SEARCH_PREV_HISTORY) ? STRbck : STRfwd;
		    *cp; *el->el_line.lastchar++ = *cp++)
			continue;
		*el->el_line.lastchar++ = pchar;
		for (cp = &el->el_search.patbuf[LEN];
		    cp < &el->el_search.patbuf[el->el_search.patlen];
		    *el->el_line.lastchar++ = *cp++)
			continue;
		*el->el_line.lastchar = '\0';
		re_refresh(el);

		if (el_wgetc(el, &ch) != 1)
			return ed_end_of_file(el, 0);

		switch (el->el_map.current[(unsigned char) ch]) {
		case ED_INSERT:
		case ED_DIGIT:
			if (el->el_search.patlen >= EL_BUFSIZ - LEN)
				terminal_beep(el);
			else {
				el->el_search.patbuf[el->el_search.patlen++] =
				    ch;
				*el->el_line.lastchar++ = ch;
				*el->el_line.lastchar = '\0';
				re_refresh(el);
			}
			break;

		case EM_INC_SEARCH_NEXT:
			newdir = ED_SEARCH_NEXT_HISTORY;
			redo++;
			break;

		case EM_INC_SEARCH_PREV:
			newdir = ED_SEARCH_PREV_HISTORY;
			redo++;
			break;

		case EM_DELETE_PREV_CHAR:
		case ED_DELETE_PREV_CHAR:
			if (el->el_search.patlen > LEN)
				done++;
			else
				terminal_beep(el);
			break;

		default:
			switch (ch) {
			case 0007:	/* ^G: Abort */
				ret = CC_ERROR;
				done++;
				break;

			case 0027:	/* ^W: Append word */
			/* No can do if globbing characters in pattern */
				for (cp = &el->el_search.patbuf[LEN];; cp++)
				    if (cp >= &el->el_search.patbuf[
					el->el_search.patlen]) {
					if (el->el_line.cursor ==
					    el->el_line.buffer)
						break;
					el->el_line.cursor +=
					    el->el_search.patlen - LEN - 1;
					cp = c__next_word(el->el_line.cursor,
					    el->el_line.lastchar, 1,
					    ce__isword);
					while (el->el_line.cursor < cp &&
					    *el->el_line.cursor != '\n') {
						if (el->el_search.patlen >=
						    EL_BUFSIZ - LEN) {
							terminal_beep(el);
							break;
						}
						el->el_search.patbuf[el->el_search.patlen++] =
						    *el->el_line.cursor;
						*el->el_line.lastchar++ =
						    *el->el_line.cursor++;
					}
					el->el_line.cursor = ocursor;
					*el->el_line.lastchar = '\0';
					re_refresh(el);
					break;
				    } else if (isglob(*cp)) {
					    terminal_beep(el);
					    break;
				    }
				break;

			default:	/* Terminate and execute cmd */
				endcmd[0] = ch;
				el_wpush(el, endcmd);
				/* FALLTHROUGH */

			case 0033:	/* ESC: Terminate */
				ret = CC_REFRESH;
				done++;
				break;
			}
			break;
		}

		while (el->el_line.lastchar > el->el_line.buffer &&
		    *el->el_line.lastchar != '\n')
			*el->el_line.lastchar-- = '\0';
		*el->el_line.lastchar = '\0';

		if (!done) {

			/* Can't search if unmatched '[' */
			for (cp = &el->el_search.patbuf[el->el_search.patlen-1],
			    ch = L']';
			    cp >= &el->el_search.patbuf[LEN];
			    cp--)
				if (*cp == '[' || *cp == ']') {
					ch = *cp;
					break;
				}
			if (el->el_search.patlen > LEN && ch != L'[') {
				if (redo && newdir == dir) {
					if (pchar == '?') { /* wrap around */
						el->el_history.eventno =
						    newdir == ED_SEARCH_PREV_HISTORY ? 0 : 0x7fffffff;
						if (hist_get(el) == CC_ERROR)
							/* el->el_history.event
							 * no was fixed by
							 * first call */
							(void) hist_get(el);
						el->el_line.cursor = newdir ==
						    ED_SEARCH_PREV_HISTORY ?
						    el->el_line.lastchar :
						    el->el_line.buffer;
					} else
						el->el_line.cursor +=
						    newdir ==
						    ED_SEARCH_PREV_HISTORY ?
						    -1 : 1;
				}
#ifdef ANCHOR
				el->el_search.patbuf[el->el_search.patlen++] =
				    '.';
				el->el_search.patbuf[el->el_search.patlen++] =
				    '*';
#endif
				el->el_search.patbuf[el->el_search.patlen] =
				    '\0';
				if (el->el_line.cursor < el->el_line.buffer ||
				    el->el_line.cursor > el->el_line.lastchar ||
				    (ret = ce_search_line(el, newdir))
				    == CC_ERROR) {
					/* avoid c_setpat */
					el->el_state.lastcmd =
					    (el_action_t) newdir;
					ret = (el_action_t)
					    (newdir == ED_SEARCH_PREV_HISTORY ?
					    ed_search_prev_history(el, 0) :
					    ed_search_next_history(el, 0));
					if (ret != CC_ERROR) {
						el->el_line.cursor = newdir ==
						    ED_SEARCH_PREV_HISTORY ?
						    el->el_line.lastchar :
						    el->el_line.buffer;
						(void) ce_search_line(el,
						    newdir);
					}
				}
				el->el_search.patlen -= LEN;
				el->el_search.patbuf[el->el_search.patlen] =
				    '\0';
				if (ret == CC_ERROR) {
					terminal_beep(el);
					if (el->el_history.eventno !=
					    ohisteventno) {
						el->el_history.eventno =
						    ohisteventno;
						if (hist_get(el) == CC_ERROR)
							return CC_ERROR;
					}
					el->el_line.cursor = ocursor;
					pchar = '?';
				} else {
					pchar = ':';
				}
			}
			ret = ce_inc_search(el, newdir);

			if (ret == CC_ERROR && pchar == '?' && oldpchar == ':')
				/*
				 * break abort of failed search at last
				 * non-failed
				 */
				ret = CC_NORM;

		}
		if (ret == CC_NORM || (ret == CC_ERROR && oldpatlen == 0)) {
			/* restore on normal return or error exit */
			pchar = oldpchar;
			el->el_search.patlen = oldpatlen;
			if (el->el_history.eventno != ohisteventno) {
				el->el_history.eventno = ohisteventno;
				if (hist_get(el) == CC_ERROR)
					return CC_ERROR;
			}
			el->el_line.cursor = ocursor;
			if (ret == CC_ERROR)
				re_refresh(el);
		}
		if (done || ret != CC_NORM)
			return ret;
	}
}